

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

void __thiscall QIODevicePrivate::~QIODevicePrivate(QIODevicePrivate *this)

{
  Data *pDVar1;
  undefined1 *puVar2;
  long lVar3;
  QArrayDataPointer<QRingChunk> *pQVar4;
  
  this->_vptr_QIODevicePrivate = (_func_int **)&PTR__QIODevicePrivate_0018a6d0;
  pDVar1 = (this->errorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar3 = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar3) {
    pQVar4 = (QArrayDataPointer<QRingChunk> *)
             (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    lVar3 = lVar3 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar4);
      pQVar4 = (QArrayDataPointer<QRingChunk> *)&pQVar4[1].size;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  puVar2 = (undefined1 *)(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  if ((QVarLengthArray<QRingBuffer,_1LL> *)puVar2 != &this->writeBuffers) {
    QtPrivate::sizedFree
              (puVar2,(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a * 0x28);
  }
  lVar3 = (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar3) {
    pQVar4 = (QArrayDataPointer<QRingChunk> *)
             (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    lVar3 = lVar3 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar4);
      pQVar4 = (QArrayDataPointer<QRingChunk> *)&pQVar4[1].size;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  puVar2 = (undefined1 *)(this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
  if ((QVarLengthArray<QRingBuffer,_2LL> *)puVar2 != &this->readBuffers) {
    QtPrivate::sizedFree
              (puVar2,(this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a * 0x28);
    return;
  }
  return;
}

Assistant:

QIODevicePrivate::~QIODevicePrivate()
{
}